

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::SpectrumBilerpTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumBilerpTexture *this)

{
  SpectrumHandle *in_stack_fffffffffffffff0;
  
  StringPrintf<pbrt::TextureMapping2DHandle_const&,pbrt::SpectrumHandle_const&,pbrt::SpectrumHandle_const&,pbrt::SpectrumHandle_const&,pbrt::SpectrumHandle_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ SpectrumBilerpTexture mapping: %s v00: %s v01: %s v10: %s v11: %s ]",
             (char *)this,(TextureMapping2DHandle *)&this->v00,&this->v01,&this->v10,&this->v11,
             in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumBilerpTexture::ToString() const {
    return StringPrintf(
        "[ SpectrumBilerpTexture mapping: %s v00: %s v01: %s v10: %s v11: %s ]", mapping,
        v00, v01, v10, v11);
}